

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Address __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::getMemorySize
          (ModuleRunnerBase<wasm::ModuleRunner> *this,Name memory)

{
  iterator iVar1;
  undefined1 local_28 [8];
  Name memory_local;
  
  memory_local.super_IString.str._M_len = memory.super_IString.str._M_str;
  local_28 = memory.super_IString.str._M_len;
  iVar1 = std::
          _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Address>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->memorySizes)._M_h,(key_type *)local_28);
  if (iVar1.super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Address>,_true>._M_cur ==
      (__node_type *)0x0) {
    (*this->externalInterface->_vptr_ExternalInterface[8])
              (this->externalInterface,"getMemorySize called on non-existing memory");
  }
  return (Address)*(address64_t *)
                   ((long)iVar1.
                          super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Address>,_true>
                          ._M_cur + 0x18);
}

Assistant:

Address getMemorySize(Name memory) {
    auto iter = memorySizes.find(memory);
    if (iter == memorySizes.end()) {
      externalInterface->trap("getMemorySize called on non-existing memory");
    }
    return iter->second;
  }